

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Track::VetEntry(Track *this,BlockEntry *pBlockEntry)

{
  int iVar1;
  undefined4 extraout_var;
  bool bVar2;
  
  iVar1 = (*pBlockEntry->_vptr_BlockEntry[2])(pBlockEntry);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = *(long *)(CONCAT44(extraout_var,iVar1) + 0x10) == (this->m_info).number;
  }
  return bVar2;
}

Assistant:

bool Track::VetEntry(const BlockEntry* pBlockEntry) const {
  assert(pBlockEntry);
  const Block* const pBlock = pBlockEntry->GetBlock();
  assert(pBlock);
  assert(pBlock->GetTrackNumber() == m_info.number);
  if (!pBlock || pBlock->GetTrackNumber() != m_info.number)
    return false;

  // This function is used during a seek to determine whether the
  // frame is a valid seek target.  This default function simply
  // returns true, which means all frames are valid seek targets.
  // It gets overridden by the VideoTrack class, because only video
  // keyframes can be used as seek target.

  return true;
}